

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliqueFinder.hpp
# Opt level: O3

uint FMB::CliqueFinder::findMaxCliqueSize
               (DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                *Ngraph)

{
  Entry *pEVar1;
  int *piVar2;
  Stack<unsigned_int> *pSVar3;
  uint uVar4;
  uint uVar5;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *pDVar6;
  Entry *pEVar7;
  bool bVar8;
  Entry *e;
  Entry *pEVar9;
  uint *puVar10;
  Entry *pEVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong local_80;
  VirtualIterator<unsigned_int> local_70;
  Stack<unsigned_int> local_68;
  DArray<Lib::Stack<unsigned_int>_> local_48;
  
  local_48._size = 0;
  local_48._capacity = 0;
  local_48._array = (Stack<unsigned_int> *)0x0;
  Lib::DArray<Lib::Stack<unsigned_int>_>::ensure(&local_48,(ulong)(Ngraph->_size + 1));
  pEVar11 = Ngraph->_afterLast;
  if (Ngraph->_entries != pEVar11) {
    uVar4 = Ngraph->_timestamp;
    pEVar9 = Ngraph->_entries;
    do {
      while (pEVar1 = pEVar9 + 1,
            ((pEVar9->field_0)._infoData & 1U) != 0 ||
            (uint)(pEVar9->field_0)._infoData >> 2 != uVar4) {
        pEVar9 = pEVar1;
        if (pEVar1 == pEVar11) goto LAB_00297f2c;
      }
      uVar16 = (ulong)(uint)(pEVar9->_val->_map)._size;
      if (uVar16 != 0) {
        uVar5 = pEVar9->_key;
        lVar14 = uVar16 << 5;
        do {
          uVar16 = uVar16 - 1;
          pSVar3 = (Stack<unsigned_int> *)((long)&(local_48._array)->_capacity + lVar14);
          puVar10 = *(uint **)((long)&(local_48._array)->_cursor + lVar14);
          if (puVar10 == *(uint **)((long)&(local_48._array)->_end + lVar14)) {
            Lib::Stack<unsigned_int>::expand(pSVar3);
            puVar10 = pSVar3->_cursor;
          }
          *puVar10 = uVar5;
          pSVar3->_cursor = puVar10 + 1;
          lVar14 = lVar14 + -0x20;
        } while ((int)uVar16 != 0);
      }
      pEVar9 = pEVar1;
    } while (pEVar1 != pEVar11);
  }
LAB_00297f2c:
  if (1 < (int)local_48._size - 1U) {
    uVar13 = (ulong)((int)local_48._size - 1U);
    uVar16 = local_48._size;
    do {
      uVar15 = uVar13;
      local_80 = uVar16 & 0xffffffff;
      puVar10 = local_48._array[uVar15]._cursor;
      pSVar3 = local_48._array + uVar15;
      uVar13 = (long)puVar10 - (long)local_48._array[uVar15]._stack >> 2;
      if (uVar13 == local_80) {
        bVar8 = checkClique(Ngraph,pSVar3);
        if (bVar8) goto LAB_0029816c;
      }
      else if (local_80 < uVar13) {
        while( true ) {
          local_80._0_4_ = (uint)uVar16;
          if ((uint)uVar13 < (uint)local_80) break;
          do {
            if (puVar10 == pSVar3->_stack) goto LAB_0029814e;
            uVar4 = puVar10[-1];
            local_68._capacity = CONCAT44(local_68._capacity._4_4_,uVar4);
            pEVar11 = Lib::
                      DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                      ::findEntry(Ngraph,(uint *)&local_68);
            puVar10 = puVar10 + -1;
            pDVar6 = pEVar11->_val;
          } while (uVar15 != (uint)(pDVar6->_map)._size);
          local_68._cursor = (uint *)0x0;
          local_68._end = (uint *)0x0;
          local_68._capacity = 0;
          local_68._stack = (uint *)0x0;
          local_70._core = (IteratorCore<unsigned_int> *)::operator_new(0x28);
          (local_70._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b27d90;
          pEVar7 = (pDVar6->_map)._afterLast;
          local_70._core[1]._vptr_IteratorCore = (_func_int **)(pDVar6->_map)._entries;
          *(Entry **)&local_70._core[1]._refCnt = pEVar7;
          *(uint *)&local_70._core[2]._vptr_IteratorCore = (pDVar6->_map)._timestamp;
          (local_70._core)->_refCnt = 1;
          Lib::Stack<unsigned_int>::loadFromIterator<Lib::VirtualIterator<unsigned_int>>
                    (&local_68,&local_70);
          if (local_70._core != (IteratorCore<unsigned_int> *)0x0) {
            piVar2 = &(local_70._core)->_refCnt;
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              (*(local_70._core)->_vptr_IteratorCore[1])();
            }
          }
          if (local_68._cursor == local_68._end) {
            Lib::Stack<unsigned_int>::expand(&local_68);
          }
          *local_68._cursor = uVar4;
          local_68._cursor = local_68._cursor + 1;
          bVar8 = checkClique(Ngraph,&local_68);
          if (local_68._stack != (uint *)0x0) {
            uVar12 = local_68._capacity * 4 + 0xf & 0xfffffffffffffff0;
            if (uVar12 == 0) {
              *(undefined8 *)local_68._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
              Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack;
            }
            else if (uVar12 < 0x11) {
              *(undefined8 *)local_68._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
              Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack;
            }
            else if (uVar12 < 0x19) {
              *(undefined8 *)local_68._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
              Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack;
            }
            else if (uVar12 < 0x21) {
              *(undefined8 *)local_68._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
              Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack;
            }
            else if (uVar12 < 0x31) {
              *(undefined8 *)local_68._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
              Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack;
            }
            else if (uVar12 < 0x41) {
              *(undefined8 *)local_68._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
              Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack;
            }
            else {
              operator_delete(local_68._stack,0x10);
            }
          }
          uVar13 = (ulong)((uint)uVar13 - (uint)!bVar8);
          if (bVar8) goto LAB_0029816c;
        }
      }
LAB_0029814e:
      uVar13 = uVar15 - 1;
      uVar16 = uVar15;
    } while (2 < uVar15);
  }
  local_80 = 1;
LAB_0029816c:
  if ((local_48._array != (Stack<unsigned_int> *)0x0) &&
     (array_delete<Lib::Stack<unsigned_int>>(local_48._array,local_48._capacity),
     local_48._array != (Stack<unsigned_int> *)0x0)) {
    uVar16 = local_48._capacity << 5;
    if (uVar16 == 0) {
      (local_48._array)->_capacity = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_48._array;
    }
    else if (uVar16 < 0x21) {
      (local_48._array)->_capacity = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_48._array;
    }
    else if (uVar16 < 0x31) {
      (local_48._array)->_capacity = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_48._array;
    }
    else if (uVar16 < 0x41) {
      (local_48._array)->_capacity = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_48._array;
    }
    else {
      operator_delete(local_48._array,0x10);
    }
  }
  return (uint)local_80;
}

Assistant:

static unsigned findMaxCliqueSize(DHMap<unsigned,DHSet<unsigned>*>* Ngraph)
    {
      //std::cout << "findMaxCliqueSize with " << Ngraph->size() << std::endl;

      // at least stores the number of nodes with at least index neighbours
      DArray<Stack<unsigned>> atleast;
      atleast.ensure(Ngraph->size()+1); // the +1 is to protect against a self-loop sneaking in

      DHMap<unsigned,DHSet<unsigned>*>::Iterator miter(*Ngraph);
      while(miter.hasNext()){
        unsigned c;
        DHSet<unsigned>* nbs;
        miter.next(c,nbs);
        unsigned size = nbs->size();
        //std::cout << ">> " << c << ": " << size << std::endl;

        //DHSet<unsigned>::Iterator dit(*nbs);
        //while(dit.hasNext()){ std::cout << dit.next() << std::endl; }

        for(;size>0;size--){
          atleast[size].push(c);
        }
      }
      //std::cout << "Searching" << std::endl;

      for(unsigned i=atleast.size()-1;i>1;i--){
        // in this case we would expect atleast[i] to be the clique
        if(atleast[i].size() == i+1){
          //std::cout << "CASE 1" << std::endl;
          if(checkClique(Ngraph,atleast[i])){
            //std::cout << "FIND(A) max clique of " << (i+1) << std::endl;
            //for(unsigned j=0;j<atleast[i].size();j++){ std::cout << atleast[i][j] << " ";}; std::cout << std::endl;
            return i+1;
          }
        }
        // in this case atleast[i] may contain a clique but cannot be a clique itself
        // we need to look at subsets
        else if (atleast[i].size() > i+1){
          //std::cout << "CASE 2" << std::endl;
          unsigned left = atleast[i].size();
          Stack<unsigned>::Iterator niter(atleast[i]);
          while(niter.hasNext() && left >= i+1){
            unsigned c = niter.next();
            //std::cout << ">> " << c << std::endl;
            auto ns = Ngraph->get(c);
            if(ns->size()==i){
              Stack<unsigned> clique;
              clique.loadFromIterator(ns->iterator());
              clique.push(c);
              if(checkClique(Ngraph,clique)){
                //std::cout << "FIND(B) max clique of " << (i+1) << std::endl;
                return i+1;
              }
              left--;
            }
          }
          //std::cout << "In this case with " << std::left << " left" << std::endl;
        }
      }

      //for(unsigned i=1;i<atleast.size();i++){
      //  std::cout << i << ":"<< atleast[i].size() << std::endl; 
      //}
      return 1;
    }